

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double r8vec_dot(int n,double *a1,double *a2)

{
  double local_30;
  double value;
  int i;
  double *a2_local;
  double *a1_local;
  int n_local;
  
  local_30 = 0.0;
  for (value._4_4_ = 0; value._4_4_ < n; value._4_4_ = value._4_4_ + 1) {
    local_30 = a1[value._4_4_] * a2[value._4_4_] + local_30;
  }
  return local_30;
}

Assistant:

double r8vec_dot ( int n, double a1[], double a2[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_DOT computes the dot product of a pair of R8VEC's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 July 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, double A1[N], A2[N], the two vectors to be considered.
//
//    Output, double R8VEC_DOT, the dot product of the vectors.
//
{
  int i;
  double value;

  value = 0.0;
  for ( i = 0; i < n; i++ )
  {
    value = value + a1[i] * a2[i];
  }

  return value;
}